

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TwoStageDynamicBayesianNetwork.cpp
# Opt level: O1

double __thiscall
TwoStageDynamicBayesianNetwork::GetYProbabilityGeneral
          (TwoStageDynamicBayesianNetwork *this,Scope *Xscope,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *X,Scope *Ascope,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *A,Scope *YIIscope,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *YII,Scope *Yscope,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Y)

{
  pointer puVar1;
  pointer pSVar2;
  CPDDiscreteInterface *pCVar3;
  uint uVar4;
  Index IVar5;
  pointer puVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> X_restr;
  vector<unsigned_int,_std::allocator<unsigned_int>_> YII_restr;
  vector<unsigned_int,_std::allocator<unsigned_int>_> A_restr;
  allocator_type local_c1;
  double local_c0;
  uint local_b4;
  Scope *local_b0;
  Scope *local_a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_a0;
  Scope *local_98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_90;
  ulong local_88;
  double local_80;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  void *local_60 [2];
  long local_50;
  void *local_48 [2];
  long local_38;
  
  puVar6 = (Y->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((Y->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish == puVar6) {
    dVar9 = 1.0;
  }
  else {
    dVar9 = 1.0;
    local_b4 = 1;
    uVar7 = 0;
    local_b0 = YIIscope;
    local_a8 = Ascope;
    local_a0 = A;
    local_98 = Xscope;
    local_90 = X;
    do {
      puVar1 = (Yscope->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_80 = dVar9;
      if ((ulong)((long)(Yscope->super_SDT).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar1 >> 2) <= uVar7) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      uVar8 = (ulong)puVar1[uVar7];
      local_c0 = (double)CONCAT44(local_c0._4_4_,puVar6[uVar7]);
      pSVar2 = (this->_m_XSoI_Y).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
               super__Vector_impl_data._M_start;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_78,
                 (long)pSVar2[uVar8].super_SDT.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 *(long *)&pSVar2[uVar8].super_SDT.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                 >> 2,(allocator_type *)local_48);
      IndexTools::RestrictIndividualIndicesToNarrowerScope<unsigned_int>
                (local_90,local_98,
                 (this->_m_XSoI_Y).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar8,&local_78);
      pSVar2 = (this->_m_ASoI_Y).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_88 = uVar8;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,
                 (long)pSVar2[uVar8].super_SDT.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 *(long *)&pSVar2[uVar8].super_SDT.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                 >> 2,(allocator_type *)local_60);
      IndexTools::RestrictIndividualIndicesToNarrowerScope<unsigned_int>
                (local_a0,local_a8,
                 (this->_m_ASoI_Y).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar8,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
      pSVar2 = (this->_m_YSoI_Y).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
               super__Vector_impl_data._M_start;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60,
                 (long)pSVar2[uVar8].super_SDT.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 *(long *)&pSVar2[uVar8].super_SDT.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                 >> 2,&local_c1);
      IndexTools::RestrictIndividualIndicesToNarrowerScope<unsigned_int>
                (YII,local_b0,
                 (this->_m_YSoI_Y).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar8,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
      uVar7 = local_88;
      IVar5 = IndividualToJointYiiIndices
                        (this,(Index)local_88,&local_78,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
      pCVar3 = (this->_m_Y_CPDs).
               super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar7];
      (*pCVar3->_vptr_CPDDiscreteInterface[2])(pCVar3,(ulong)local_c0 & 0xffffffff,(ulong)IVar5);
      local_c0 = dVar9;
      if (local_60[0] != (void *)0x0) {
        operator_delete(local_60[0],local_50 - (long)local_60[0]);
      }
      if (local_48[0] != (void *)0x0) {
        operator_delete(local_48[0],local_38 - (long)local_48[0]);
      }
      uVar4 = local_b4;
      if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_78.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_78.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      dVar9 = local_80 * local_c0;
      uVar7 = (ulong)uVar4;
      puVar6 = (Y->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      local_b4 = uVar4 + 1;
    } while (uVar7 < (ulong)((long)(Y->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar6 >> 2));
  }
  return dVar9;
}

Assistant:

double TwoStageDynamicBayesianNetwork::
GetYProbabilityGeneral( 
                    const Scope& Xscope,
                    const vector<Index>& X,
                    const Scope& Ascope,
                    const vector<Index>& A,
                    const Scope& YIIscope,
                    const vector<Index>& YII,
                    const Scope& Yscope,
                    const vector<Index>& Y
                    ) const
{

    double p = 1.0;
    for(Index Y_index=0; Y_index < Y.size(); Y_index++)
    {
        //Y_index is index in vector Y
        Index y = Yscope.at(Y_index); // the index to the variable we look at
        Index yVal = Y.at(Y_index); // the value of that variable 

        vector<Index> X_restr(GetXSoI_Y(y).size());
        IndexTools::RestrictIndividualIndicesToNarrowerScope(X, Xscope, GetXSoI_Y(y), X_restr );
        vector<Index> A_restr(GetASoI_Y(y).size());
        IndexTools::RestrictIndividualIndicesToNarrowerScope(A, Ascope, GetASoI_Y(y), A_restr );
        vector<Index> YII_restr(GetYSoI_Y(y).size());
        IndexTools::RestrictIndividualIndicesToNarrowerScope(YII, YIIscope, GetYSoI_Y(y), YII_restr );
        Index iiI = IndividualToJointYiiIndices(y, X_restr, A_restr, YII_restr);
        double p_y = _m_Y_CPDs[y]->Get(yVal, iiI);
        p *= p_y;
    }
    return(p);
}